

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

void alSourceiv(ALuint name,ALenum param,ALint *values)

{
  uint uVar1;
  bool bVar2;
  uint32 x;
  ulong uVar3;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alSourceiv);
  writele32(name);
  writele32(param);
  IO_UINT64((uint64)values);
  x = 1;
  bVar2 = true;
  uVar1 = param - 0x1001;
  if (uVar1 < 0x26) {
    if ((0x3d80000143U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_00107e6a;
    if ((ulong)uVar1 == 4) {
      x = 3;
      goto LAB_00107e6a;
    }
  }
  if (param != 0x202) {
    bVar2 = false;
    x = 0;
  }
LAB_00107e6a:
  writele32(x);
  if (bVar2) {
    uVar3 = 0;
    do {
      writele32(values[uVar3]);
      uVar3 = uVar3 + 1;
    } while (x + (x == 0) != uVar3);
  }
  (*REAL_alSourceiv)(name,param,values);
  check_source_state_from_name(name);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSourceiv(ALuint name, ALenum param, const ALint *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alSourceiv);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_BUFFER: break;
        case AL_SOURCE_RELATIVE: break;
        case AL_LOOPING: break;
        case AL_REFERENCE_DISTANCE: break;
        case AL_ROLLOFF_FACTOR: break;
        case AL_MAX_DISTANCE: break;
        case AL_CONE_INNER_ANGLE: break;
        case AL_CONE_OUTER_ANGLE: break;
        case AL_DIRECTION: numvals = 3; break;
        case AL_SEC_OFFSET: break;
        case AL_SAMPLE_OFFSET: break;
        case AL_BYTE_OFFSET: break;
        default: numvals = 0; break;   /* uhoh. */
    }

    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_INT32(values[i]);
    }

    REAL_alSourceiv(name, param, values);
    check_source_state_from_name(name);
    IO_END();
}